

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

string * __thiscall
runtime::VirtualMachine::byteCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,ByteCode bc,bool panic)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  ulong __val;
  ulong uVar5;
  size_type *psVar6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  long *local_68;
  uint local_60;
  long local_58 [2];
  string local_48;
  
  __val = bc.parameter;
  switch(bc.instruction) {
  case Halt:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Halt";
    pcVar7 = "";
    break;
  case Add:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Add";
    pcVar7 = "";
    break;
  case Subtract:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Subtract";
    pcVar7 = "";
    break;
  case Multiply:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Multiply";
    pcVar7 = "";
    break;
  case Divide:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Divide";
    pcVar7 = "";
    break;
  case Print:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Print";
    pcVar7 = "";
    break;
  case Read:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Read";
    pcVar7 = "";
    break;
  case Jump:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119468;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119468;
        }
        if (uVar5 < 10000) goto LAB_00119468;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119468:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1230ec);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case JumpIfFalse:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_0011976a;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_0011976a;
        }
        if (uVar5 < 10000) goto LAB_0011976a;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_0011976a:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1230f2);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case LoadIntegerConstant:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119334;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119334;
        }
        if (uVar5 < 10000) goto LAB_00119334;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119334:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1230ff);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case LoadFloatConstant:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_001196d0;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_001196d0;
        }
        if (uVar5 < 10000) goto LAB_001196d0;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_001196d0:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x123114);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case LoadStringConstant:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119200;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119200;
        }
        if (uVar5 < 10000) goto LAB_00119200;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119200:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x123127);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case LoadUndefinedConstant:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "LoadUndefinedConstant";
    pcVar7 = "";
    break;
  case LoadBooleanTrueConstant:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "LoadBooleanTrueConstant";
    pcVar7 = "";
    break;
  case LoadBooleanFalseConstant:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "LoadBooleanFalseConstant";
    pcVar7 = "";
    break;
  case LoadLocal:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_001193ce;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_001193ce;
        }
        if (uVar5 < 10000) goto LAB_001193ce;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_001193ce:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x123182);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case SetLocal:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119166;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119166;
        }
        if (uVar5 < 10000) goto LAB_00119166;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119166:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x12318d);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case Return:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Return";
    pcVar7 = "";
    break;
  case Invoke:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119636;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119636;
        }
        if (uVar5 < 10000) goto LAB_00119636;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119636:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x12319e);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case NoOp:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "NoOp";
    pcVar7 = "";
    break;
  case MakeFn:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00119502;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00119502;
        }
        if (uVar5 < 10000) goto LAB_00119502;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_00119502:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1231ab);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case MakeObj:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_0011959c;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_0011959c;
        }
        if (uVar5 < 10000) goto LAB_0011959c;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_0011959c:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x1231b3);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    goto LAB_001197fd;
  case Less:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Less";
    pcVar7 = "";
    break;
  case LessOrEqual:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "LessOrEqual";
    pcVar7 = "";
    break;
  case Greater:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Greater";
    pcVar7 = "";
    break;
  case GreaterOrEqual:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "GreaterOrEqual";
    pcVar7 = "";
    break;
  case Not:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Not";
    pcVar7 = "";
    break;
  case Equal:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Equal";
    pcVar7 = "";
    break;
  case NotEqual:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "NotEqual";
    pcVar7 = "";
    break;
  case And:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "And";
    pcVar7 = "";
    break;
  case Or:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Or";
    pcVar7 = "";
    break;
  case GetType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "GetType";
    pcVar7 = "";
    break;
  case CastToInt:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "CastToInt";
    pcVar7 = "";
    break;
  case CastToFloat:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "CastToFloat";
    pcVar7 = "";
    break;
  case Length:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Length";
    pcVar7 = "";
    break;
  case ChatAt:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "ChatAt";
    pcVar7 = "";
    break;
  case StringAppend:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "StringAppend";
    pcVar7 = "";
    break;
  case ObjectGet:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "ObjectGet";
    pcVar7 = "";
    break;
  case ObjectSet:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "ObjectSet";
    pcVar7 = "";
    break;
  case GetEnv:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "GetEnv";
    pcVar7 = "";
    break;
  case LoadClosure:
    cVar8 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar8 = cVar3;
        if (uVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_0011929a;
        }
        if (uVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_0011929a;
        }
        if (uVar5 < 10000) goto LAB_0011929a;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_0011929a:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x12324c);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48.field_2._8_8_ = plVar4[3];
    }
    else {
      local_48.field_2._M_allocated_capacity = *psVar6;
      local_48._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_48._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
LAB_001197fd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68 == local_58) {
      return __return_storage_ptr__;
    }
    operator_delete(local_68,local_58[0] + 1);
    return __return_storage_ptr__;
  case Pop:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "Pop";
    pcVar7 = "";
    break;
  default:
    if (panic) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unkown bytecode instruction encountered","");
      VirtualMachine::panic(this,&local_48);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "<UNKNOWN>";
    pcVar7 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string runtime::VirtualMachine::byteCodeToString(bytecode::ByteCode bc, bool panic) {

  #define PARAM "(" + std::to_string(bc.parameter) + ")"

  switch (bc.instruction) {
    case bytecode::ByteCodeInstruction::Halt: return "Halt";
    case bytecode::ByteCodeInstruction::Add: return "Add";
    case bytecode::ByteCodeInstruction::Subtract: return "Subtract";
    case bytecode::ByteCodeInstruction::Multiply: return "Multiply";
    case bytecode::ByteCodeInstruction::Divide: return "Divide";
    case bytecode::ByteCodeInstruction::Print: return "Print";
    case bytecode::ByteCodeInstruction::Read: return "Read";
    case bytecode::ByteCodeInstruction::Jump: return "Jump" PARAM;
    case bytecode::ByteCodeInstruction::JumpIfFalse: return "JumpIfFalse" PARAM;
    case bytecode::ByteCodeInstruction::LoadIntegerConstant: return "LoadIntegerConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadFloatConstant: return "LoadFloatConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadStringConstant: return "LoadStringConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadUndefinedConstant: return "LoadUndefinedConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanTrueConstant: return "LoadBooleanTrueConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanFalseConstant: return "LoadBooleanFalseConstant";
    case bytecode::ByteCodeInstruction::LoadLocal: return "LoadLocal" PARAM;
    case bytecode::ByteCodeInstruction::SetLocal: return "SetLocal" PARAM;
    case bytecode::ByteCodeInstruction::Return: return "Return";
    case bytecode::ByteCodeInstruction::Invoke: return "Invoke" PARAM;
    case bytecode::ByteCodeInstruction::NoOp: return "NoOp";
    case bytecode::ByteCodeInstruction::MakeFn: return "MakeFn" PARAM;
    case bytecode::ByteCodeInstruction::MakeObj: return "MakeObj" PARAM;
    case bytecode::ByteCodeInstruction::Less: return "Less";
    case bytecode::ByteCodeInstruction::LessOrEqual: return "LessOrEqual";
    case bytecode::ByteCodeInstruction::Greater: return "Greater";
    case bytecode::ByteCodeInstruction::GreaterOrEqual: return "GreaterOrEqual";
    case bytecode::ByteCodeInstruction::Not: return "Not";
    case bytecode::ByteCodeInstruction::Equal: return "Equal";
    case bytecode::ByteCodeInstruction::NotEqual: return "NotEqual";
    case bytecode::ByteCodeInstruction::And: return "And";
    case bytecode::ByteCodeInstruction::Or: return "Or";
    case bytecode::ByteCodeInstruction::GetType: return "GetType";
    case bytecode::ByteCodeInstruction::CastToInt: return "CastToInt";
    case bytecode::ByteCodeInstruction::CastToFloat: return "CastToFloat";
    case bytecode::ByteCodeInstruction::Length: return "Length";
    case bytecode::ByteCodeInstruction::ChatAt: return "ChatAt";
    case bytecode::ByteCodeInstruction::StringAppend: return "StringAppend";
    case bytecode::ByteCodeInstruction::ObjectGet: return "ObjectGet";
    case bytecode::ByteCodeInstruction::ObjectSet: return "ObjectSet";
    case bytecode::ByteCodeInstruction::GetEnv: return "GetEnv";
    case bytecode::ByteCodeInstruction::LoadClosure: return "LoadClosure" PARAM;
    case bytecode::ByteCodeInstruction::Pop: return "Pop";
    default: {
      if (panic) {
        this->panic("Unkown bytecode instruction encountered");
        return "";
      } else {
        return "<UNKNOWN>";
      }
    }
  }

  #undef PARAM
}